

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.h
# Opt level: O3

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromFaceId(uint face_id,uchar ftag)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  uVar2 = 0;
  if (face_id != 0) {
    uVar2 = (ulong)(ftag & 7) << 0x28 | 0x200000000;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = face_id | uVar2;
  return (ON_SubD_ComponentIdTypeAndTag)(auVar1 << 0x40);
}

Assistant:

class ON_CLASS ON_SubD_ComponentIdTypeAndTag
{
public:
  static const ON_SubD_ComponentIdTypeAndTag Unset;

  /*
  Returns:
    If v is no nullptr and v->m_id > 0, a ON_SubD_ComponentIdTypeAndTag with VertexTag() = v->m_vertex_tag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromVertex(const class ON_SubDVertex* v);

  /*
  Returns:
    If vertex_id > 0, a ON_SubD_ComponentIdTypeAndTag with VertexTag() = vtag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromVertexId(unsigned vertex_id, ON_SubDVertexTag vtag);

  /*
  Parameters:
    e - [in]
      If e->m_edge_tag is ON_SubDEdgeTag::SmoothX, the ON_SubD_ComponentIdTypeAndTag EdgeTag() will be ON_SubDEdgeTag::Smoooth.
  Returns:
    If e is not nullptr and e->m_id > 0, a ON_SubD_ComponentIdTypeAndTag with EdgeTag() = e->m_edge_tag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromEdge(const class ON_SubDEdge* e);

  /*
  Parameters:
    eptr - [in]
      If e->m_edge_tag is ON_SubDEdgeTag::SmoothX, the ON_SubD_ComponentIdTypeAndTag EdgeTag() will be ON_SubDEdgeTag::Smoooth.
  Returns:
    If e is not nullptr and e->m_id > 0, a ON_SubD_ComponentIdTypeAndTag with EdgeTag() = e->m_edge_tag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromEdge(const class ON_SubDEdgePtr eptr);


  /*
  Parameters:
    edge_id - [in]
    etag - [in]
      If etag is ON_SubDEdgeTag::SmoothX, the ON_SubD_ComponentIdTypeAndTag EdgeTag() will be ON_SubDEdgeTag::Smoooth.
  Returns:
    If edge_id > 0, a ON_SubD_ComponentIdTypeAndTag with EdgeTag() = etag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag);

  /*
  Parameters:
    edge_id - [in]
    etag - [in]
      If etag is ON_SubDEdgeTag::SmoothX, the ON_SubD_ComponentIdTypeAndTag EdgeTag() will be ON_SubDEdgeTag::Smoooth.
  Returns:
    If edge_id > 0, a ON_SubD_ComponentIdTypeAndTag with EdgeTag() = etag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag, ON_SubDEdgeSharpness sharpness);


  /*
  Parameters:
    f - [in]
    ftag - [in]
      Any value and the interpretation is up to the context using the ON_SubD_ComponentIdTypeAndTag.
  Returns:
    If f is no nullptr and f->m_id > 0, a ON_SubD_ComponentIdTypeAndTag with FaceTag() = ftag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  Remarks:
    SubD faces do not have a tag in the sense that vertices and edges do, but in complex editing tasks
    it is sometimes useful to include faces in an array of ON_SubD_ComponentIdTypeAndTag elements.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromFace(const class ON_SubDFace* f, unsigned char ftag);

  /*
  Parameters:
    face_id - [in]
    ftag - [in]
      Any value from 0 to 7. The interpretation is up to the context using the ON_SubD_ComponentIdTypeAndTag.
  Returns:
    If face_id > 0, a ON_SubD_ComponentIdTypeAndTag with FaceTag() = vtag is returned.
    Otherwise ON_SubD_ComponentIdTypeAndTag::Unset is returned.
  Remarks:
    SubD faces do not have a tag in the sense that vertices and edges do, but in complex editing tasks
    it is sometimes useful to include faces in an array of ON_SubD_ComponentIdTypeAndTag elements.
  */
  static const ON_SubD_ComponentIdTypeAndTag CreateFromFaceId(unsigned face_id, unsigned char ftag);

  /*
  Description:
    Dictionary compare on ComponentType() and ComponentId() in that order.
  */
  static int CompareTypeAndId(const ON_SubD_ComponentIdTypeAndTag* lhs, const ON_SubD_ComponentIdTypeAndTag* rhs);

  /*
  Description:
    Dictionary compare on ComponentType(), ComponentId(), and tag in that order.
  */
  static int CompareTypeAndIdAndTag(const ON_SubD_ComponentIdTypeAndTag* lhs, const ON_SubD_ComponentIdTypeAndTag* rhs);

  static const ON_SubD_ComponentIdTypeAndTag FindFromTypeAndId(ON_SubDComponentPtr::Type type, unsigned id, const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags);

  /*
  Parameters:
    v - [in]
    sorted_tags[] - [in]
      Array sorted by ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId().
  Returns:
    If v is in sorted_tags[], the VertexTag() from from sorted_tags[] is returned.
    Otherwise v->m_vertex_tag is returned.
  */
  static ON_SubDVertexTag OriginalVertexTag(
    const class ON_SubDVertex* v,
    const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags
  );

  /*
  Parameters:
    vertex_id - [in]
    sorted_tags[] - [in]
      Array sorted by ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId().
  Returns:
    If vertex_id is in sorted_tags[], the VertexTag() from from sorted_tags[] is returned.
    Otherwise ON_SubDVertexTag::Unset is returned.
  */
  static ON_SubDVertexTag OriginalVertexTag(
    unsigned vertex_id,
    const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags
  );

  /*
  Parameters:
    e - [in]
    sorted_tags[] - [in]
      Array sorted by ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId().
  Returns:
    If e is in sorted_tags[], the EdgeTag() from from sorted_tags[] is returned.
    Otherwise e->m_edge_tag is returned.
  */
  static ON_SubDEdgeTag OriginalEdgeTag(
    const class ON_SubDEdge* e,
    const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags
  );

  /*
  Parameters:
    edge_id - [in]
    sorted_tags[] - [in]
      Array sorted by ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId().
  Returns:
    If edge_id is in sorted_tags[], the EdgeTag() from from sorted_tags[] is returned.
    Otherwise ON_SubDEdgeTag::Unset is returned.
  */
  static ON_SubDEdgeTag OriginalEdgeTag(
    unsigned edge_id,
    const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags
  );

  /*
  Parameters:
    f - [in]
    sorted_tags[] - [in]
      Array sorted by ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId().
  Returns:
    If f is in sorted_tags[], the FaceTag() from from sorted_tags[] is returned.
    Otherwise 0 is returned.
  */
  static unsigned char OriginalFaceTag(
    const class ON_SubDFace* f,
    const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags
  );

  /*
  Parameters:
    face_id - [in]
    sorted_tags[] - [in]
      Array sorted by ON_SubD_ComponentIdTypeAndTag::CompareTypeAndId().
  Returns:
    If face_id is in sorted_tags[], the FaceTag() from from sorted_tags[] is returned.
    Otherwise ON_SubDFaceTag::Unset is returned.
  */
  static unsigned char OriginalFaceTag(
    unsigned face_id,
    const ON_SimpleArray< ON_SubD_ComponentIdTypeAndTag>& sorted_tags
  );

  ON_SubDComponentPtr::Type ComponentType() const;

  ON_SubDVertexTag VertexTag() const;

  unsigned VertexId() const;

  /*
  Returns:
    ON_SubDEdgeTag::Unset, ON_SubDEdgeTag::Smooth, or ON_SubDEdgeTag::Crease.
  */
  ON_SubDEdgeTag EdgeTag() const;

  unsigned EdgeId() const;

  const ON_SubDEdgeSharpness EdgeSharpness(bool bUseCreaseSharpness) const;
  
  const double VertexSharpness() const;
  void SetVertexSharpness(double s);

  unsigned char FaceTag() const;

  unsigned FaceId() const;

  const ON_wString ToString() const;

private:
  // Dale lear 2024 Feb 20
  // Replaced unsued 
  // ON_SubDComponentPtr m_cptr 
  // with 
  // ON_SubDEdgeSharpness m_sharpness. 
  // 8 = sizeof(ON_SubDComponentPtr) = ON_SubDEdgeSharpness(ON_SubDEdgeSharpness),
  // so this switch does not change the sizeof(ON_SubD_ComponentIdTypeAndTag)
  // and everything involved is a private member. 
  // Thus, this change does not "break the SDK."
  ON_SubDEdgeSharpness m_sharpness = ON_SubDEdgeSharpness::Smooth;
  unsigned m_id = 0;
  ON_SubDComponentPtr::Type m_type = ON_SubDComponentPtr::Type::Unset;
  // tag = (0x07 & m_tag_and_dir).
  // dir = (0x80 & dir) ? 1 : 0; 1 = reversed.
  unsigned char m_tag_and_dirx = 0;

  // returns (0x07 & m_tag_and_dir);
  unsigned char Internal_Tag() const;

  void Internal_SetTag(unsigned char tag);

  // returns (0x80 & m_tag_and_dir) != 0 ? 1 : 0;
  unsigned char Internal_Dir() const;

  void Internal_SetDir(unsigned char dir);


  unsigned short m_reserved = 0;
}